

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteFlat<duckdb::string_t,int,int,duckdb::BinaryStandardOperatorWrapper,duckdb::GetBitOperator,bool,false,false>
               (Vector *left,Vector *right,Vector *result,idx_t count,bool fun)

{
  bool bVar1;
  TemplatedValidityMask<unsigned_long> *this;
  TemplatedValidityMask<unsigned_long> *count_00;
  ValidityMask *pVVar2;
  Vector *in_RDX;
  ValidityMask *result_validity;
  int *result_data;
  int *rdata;
  string_t *ldata;
  undefined7 in_stack_00000050;
  ValidityMask *in_stack_ffffffffffffff88;
  TemplatedValidityMask<unsigned_long> *other;
  
  FlatVector::GetData<duckdb::string_t>((Vector *)0xbd5c2b);
  FlatVector::GetData<int>((Vector *)0xbd5c3a);
  duckdb::Vector::SetVectorType((VectorType)in_RDX);
  this = (TemplatedValidityMask<unsigned_long> *)FlatVector::GetData<int>((Vector *)0xbd5c55);
  count_00 = &FlatVector::Validity((Vector *)0xbd5c64)->super_TemplatedValidityMask<unsigned_long>;
  bVar1 = BinaryStandardOperatorWrapper::AddsNulls();
  if (bVar1) {
    other = count_00;
    FlatVector::Validity((Vector *)0xbd5c8b);
    TemplatedValidityMask<unsigned_long>::Copy(this,other,(idx_t)count_00);
    bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(other);
    if (bVar1) {
      FlatVector::Validity((Vector *)0xbd5cc1);
      TemplatedValidityMask<unsigned_long>::Copy(this,other,(idx_t)count_00);
    }
    else {
      pVVar2 = FlatVector::Validity((Vector *)0xbd5ce9);
      duckdb::ValidityMask::Combine((ValidityMask *)other,(ulong)pVVar2);
    }
  }
  else {
    FlatVector::Validity((Vector *)0xbd5d11);
    FlatVector::SetValidity(in_RDX,in_stack_ffffffffffffff88);
    pVVar2 = FlatVector::Validity((Vector *)0xbd5d32);
    duckdb::ValidityMask::Combine((ValidityMask *)count_00,(ulong)pVVar2);
  }
  ExecuteFlatLoop<duckdb::string_t,int,int,duckdb::BinaryStandardOperatorWrapper,duckdb::GetBitOperator,bool,false,false>
            ((string_t *)result,(int *)count,(int *)CONCAT17(fun,in_stack_00000050),(idx_t)ldata,
             (ValidityMask *)rdata,result_data._7_1_);
  return;
}

Assistant:

static void ExecuteFlat(Vector &left, Vector &right, Vector &result, idx_t count, FUNC fun) {
		auto ldata = FlatVector::GetData<LEFT_TYPE>(left);
		auto rdata = FlatVector::GetData<RIGHT_TYPE>(right);

		if ((LEFT_CONSTANT && ConstantVector::IsNull(left)) || (RIGHT_CONSTANT && ConstantVector::IsNull(right))) {
			// either left or right is constant NULL: result is constant NULL
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(result, true);
			return;
		}

		result.SetVectorType(VectorType::FLAT_VECTOR);
		auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
		auto &result_validity = FlatVector::Validity(result);
		if (LEFT_CONSTANT) {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(right), count);
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(right));
			}
		} else if (RIGHT_CONSTANT) {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(left), count);
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(left));
			}
		} else {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(left), count);
				if (result_validity.AllValid()) {
					result_validity.Copy(FlatVector::Validity(right), count);
				} else {
					result_validity.Combine(FlatVector::Validity(right), count);
				}
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(left));
				result_validity.Combine(FlatVector::Validity(right), count);
			}
		}
		ExecuteFlatLoop<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE, OPWRAPPER, OP, FUNC, LEFT_CONSTANT, RIGHT_CONSTANT>(
		    ldata, rdata, result_data, count, result_validity, fun);
	}